

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::GenerateMetadataFile
               (FileDescriptor *file,bool is_descriptor,GeneratorContext *generator_context)

{
  int iVar1;
  undefined4 extraout_var;
  string fullname;
  string filename;
  Printer printer;
  string local_110;
  string local_f0;
  string local_d0;
  Printer local_b0;
  ZeroCopyOutputStream *output;
  
  GeneratedMetadataFileName(&local_d0,*(string **)file,is_descriptor);
  iVar1 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_d0);
  output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar1);
  io::Printer::Printer(&local_b0,output,'^');
  io::Printer::Print(&local_b0,
                     "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
                     ,"filename",*(string **)file);
  FilenameToClassname(&local_f0,&local_d0);
  iVar1 = std::__cxx11::string::find_last_of((char *)&local_f0,0x354046,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_110,(ulong)&local_f0);
  io::Printer::Print(&local_b0,"namespace ^name^;\n\n","name",&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (iVar1 == -1) {
    io::Printer::Print(&local_b0,"class ^name^\n{\n","name",&local_f0);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_110,(ulong)&local_f0);
    io::Printer::Print(&local_b0,"class ^name^\n{\n","name",&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  io::Printer::Indent(&local_b0);
  io::Printer::Indent(&local_b0);
  GenerateAddFileToPool(file,is_descriptor,&local_b0);
  io::Printer::Outdent(&local_b0);
  io::Printer::Outdent(&local_b0);
  io::Printer::Print(&local_b0,"}\n\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  io::Printer::~Printer(&local_b0);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenerateMetadataFile(const FileDescriptor* file,
                          bool is_descriptor,
                          GeneratorContext* generator_context) {
  std::string filename = GeneratedMetadataFileName(file->name(), is_descriptor);
  scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  printer.Print(
      "namespace ^name^;\n\n",
      "name", fullname.substr(0, lastindex));

  if (lastindex != string::npos) {
    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname.substr(lastindex + 1));
  } else {
    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname);
  }
  Indent(&printer);

  GenerateAddFileToPool(file, is_descriptor, &printer);

  Outdent(&printer);
  printer.Print("}\n\n");
}